

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

FunctionLookupChain * __thiscall
anon_unknown.dwarf_e7629::FunctionLookupChain::next
          (FunctionLookupChain *__return_storage_ptr__,FunctionLookupChain *this)

{
  NodeIterator it;
  bool_type bVar1;
  bool bVar2;
  undefined1 local_50 [8];
  Node curr_1;
  undefined1 local_20 [8];
  Node curr;
  FunctionLookupChain *this_local;
  
  curr.node = (Node *)this;
  bVar1 = DirectChainedMap::NodeIterator::operator_cast_to_function_pointer((NodeIterator *)this);
  if (bVar1 == 0) {
    __assert_fail("node",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x28e,"FunctionLookupChain (anonymous namespace)::FunctionLookupChain::next()");
  }
  it.start = (this->node).start;
  it.node = (this->node).node;
  _local_20 = DirectChainedMap<IdentifierLookupResult>::next(&this->scope->idLookupMap,it);
  bVar1 = DirectChainedMap::NodeIterator::operator_cast_to_function_pointer
                    ((NodeIterator *)local_20);
  if (bVar1 == 0) {
    do {
      bVar2 = false;
      if (this->scope != (ScopeData *)0x0) {
        bVar2 = this->scope->scope != (ScopeData *)0x0;
      }
      if (!bVar2) {
        FunctionLookupChain(__return_storage_ptr__);
        return __return_storage_ptr__;
      }
      this->scope = this->scope->scope;
      _local_50 = DirectChainedMap<IdentifierLookupResult>::first
                            (&this->scope->idLookupMap,*(uint *)(this->node).node);
      bVar1 = DirectChainedMap::NodeIterator::operator_cast_to_function_pointer
                        ((NodeIterator *)local_50);
    } while (bVar1 == 0);
    if (*(long *)(curr_1.start + 8) == 0) {
      FunctionLookupChain(__return_storage_ptr__,_local_50,this->scope);
    }
    else {
      FunctionLookupChain(__return_storage_ptr__);
    }
  }
  else if (*(long *)(curr.start + 8) == 0) {
    curr_1.node = (Node *)local_20;
    FunctionLookupChain(__return_storage_ptr__,_local_20,this->scope);
  }
  else {
    FunctionLookupChain(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

FunctionLookupChain next()
		{
			assert(node);

			// Try the next variable in current scope
			if(Node curr = scope->idLookupMap.next(node))
			{
				// Scopes with mixed variables and functions will block function overload visibility
				if(curr.node->value.variable)
					return FunctionLookupChain();

				return FunctionLookupChain(curr, scope);
			}

			// Search in next scopes
			while(scope && scope->scope)
			{
				scope = scope->scope;

				if(Node curr = scope->idLookupMap.first(node.node->hash))
				{
					// Scopes with mixed variables and functions will block function overload visibility
					if(curr.node->value.variable)
						return FunctionLookupChain();

					return FunctionLookupChain(curr, scope);
				}
			}

			return FunctionLookupChain();
		}